

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.c
# Opt level: O2

void BrotliCompressFragmentFastImpl15
               (MemoryManager *m,uint8_t *input,size_t input_size,int is_last,int *table,
               uint8_t *cmd_depth,uint16_t *cmd_bits,size_t *cmd_code_numbits,uint8_t *cmd_code,
               size_t *storage_ix,uint8_t *storage)

{
  dword *pdVar1;
  byte bVar2;
  byte bVar3;
  ushort *puVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  size_t j;
  uint32_t *puVar8;
  byte *pbVar9;
  byte bVar10;
  ulong uVar11;
  size_t storage_ix_start;
  dword *pdVar12;
  Elf64_Ehdr *array;
  uint8_t *puVar13;
  size_t i;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  uint8_t *puVar20;
  long *data;
  uint8_t *puVar21;
  ulong uVar22;
  long *plVar23;
  ulong uVar24;
  long *begin;
  long *plVar25;
  long *plVar26;
  long *plVar27;
  int iVar28;
  uint8_t *puVar29;
  uint8_t *puVar30;
  bool bVar31;
  uint8_t *local_5d8;
  Elf64_Ehdr *local_5b8;
  Elf64_Ehdr *local_5a0;
  ulong local_590;
  uint32_t cmd_histo [128];
  uint8_t lit_depth [256];
  uint16_t lit_bits [256];
  
  local_5b8 = (Elf64_Ehdr *)0x18000;
  if (input_size < 0x18000) {
    local_5b8 = (Elf64_Ehdr *)input_size;
  }
  storage_ix_start = *storage_ix;
  BrotliStoreMetaBlockHeader((size_t)local_5b8,0,storage_ix,storage);
  uVar14 = *storage_ix;
  uVar11 = uVar14 >> 3;
  *(ulong *)(storage + uVar11) = (ulong)storage[uVar11];
  *storage_ix = uVar14 + 0xd;
  local_590 = BuildAndStoreLiteralPrefixCode
                        (m,input,(size_t)local_5b8,lit_depth,lit_bits,storage_ix,storage);
  for (uVar14 = 0; uVar11 = *cmd_code_numbits, uVar14 + 7 < uVar11; uVar14 = uVar14 + 8) {
    uVar11 = *storage_ix;
    *(ulong *)(storage + (uVar11 >> 3)) =
         (ulong)cmd_code[uVar14 >> 3] << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
    *storage_ix = uVar11 + 8;
  }
  uVar14 = *storage_ix;
  *(ulong *)(storage + (uVar14 >> 3)) =
       (ulong)cmd_code[uVar11 >> 3] << ((byte)uVar14 & 7) | (ulong)storage[uVar14 >> 3];
  *storage_ix = ((uint)uVar11 & 7) + uVar14;
  begin = (long *)input;
LAB_0012ee87:
  plVar27 = begin;
  plVar25 = begin;
  local_5a0 = local_5b8;
  do {
    memcpy(cmd_histo,kCmdHistoSeed,0x200);
    data = (long *)((long)plVar25 + (long)local_5a0);
    if ((Elf64_Ehdr *)0xf < local_5a0) {
      pdVar1 = (dword *)((long)&local_5a0[-1].e_shentsize + 1);
      pdVar12 = &((Elf64_Ehdr *)(input_size + -0x40))->e_flags;
      if (pdVar1 < &((Elf64_Ehdr *)(input_size + -0x40))->e_flags) {
        pdVar12 = pdVar1;
      }
      uVar14 = 0xffffffffffffffff;
      plVar26 = plVar25;
LAB_0012ef12:
      lVar16 = *(long *)((long)plVar26 + 1);
      iVar6 = (int)uVar14;
      uVar11 = 0x20;
      plVar26 = (long *)((long)plVar26 + 1);
      do {
        plVar23 = (long *)((uVar11 >> 5) + (long)plVar26);
        if ((long *)((long)pdVar12 + (long)plVar25) < plVar23) break;
        uVar19 = (ulong)(lVar16 * 0x1e35a7bd000000) >> 0x31;
        lVar16 = *plVar23;
        iVar28 = (int)input;
        if ((((int)*plVar26 == *(int *)((long)plVar26 + -(long)iVar6)) &&
            (puVar29 = (uint8_t *)((long)plVar26 + -(long)iVar6),
            *(uint8_t *)((long)plVar26 + 4) == puVar29[4])) && (0 < iVar6)) {
          table[uVar19] = (int)plVar26 - iVar28;
LAB_0012ef6d:
          uVar19 = (long)plVar26 - (long)puVar29;
          if ((long)uVar19 < 0x3fff1) goto LAB_0012efb1;
        }
        else {
          iVar18 = table[uVar19];
          table[uVar19] = (int)plVar26 - iVar28;
          if (((int)*plVar26 == *(int *)(input + iVar18)) &&
             (puVar29 = input + iVar18, *(uint8_t *)((long)plVar26 + 4) == puVar29[4]))
          goto LAB_0012ef6d;
        }
        uVar11 = (ulong)((int)uVar11 + 1);
        plVar26 = plVar23;
      } while( true );
    }
LAB_0012fca7:
    input_size = input_size - (long)local_5a0;
    local_5a0 = (Elf64_Ehdr *)0x10000;
    if (input_size < (Elf64_Ehdr *)0x10000) {
      local_5a0 = (Elf64_Ehdr *)input_size;
    }
    if ((((Elf64_Ehdr *)input_size == (Elf64_Ehdr *)0x0) ||
        (local_5b8 = (Elf64_Ehdr *)
                     (local_5a0->e_ident_magic_str + (long)(local_5b8->e_ident_magic_str + -2)),
        &Elf64_Ehdr_00100000 < local_5b8)) ||
       (array = local_5a0, iVar6 = ShouldMergeBlock((uint8_t *)data,(size_t)local_5a0,lit_depth),
       iVar6 == 0)) goto LAB_0012fd23;
    UpdateBits((ulong)((int)local_5b8 - 1),(int)storage_ix_start + 3,(size_t)storage,
               &array->e_ident_magic_num);
    plVar25 = data;
  } while( true );
LAB_0012efb1:
  puVar13 = (uint8_t *)((long)data + (-5 - (long)plVar26));
  puVar21 = (uint8_t *)((ulong)puVar13 & 0xfffffffffffffff8);
  uVar11 = 0;
  lVar16 = 0;
LAB_0012efd5:
  if ((ulong)puVar13 >> 3 == uVar11) {
    uVar11 = (ulong)((uint)puVar13 & 7);
    puVar30 = (uint8_t *)((long)plVar26 + (5 - lVar16));
    for (; (bVar31 = uVar11 != 0, uVar11 = uVar11 - 1, local_5d8 = puVar13, bVar31 &&
           (local_5d8 = puVar21, puVar29[(long)(puVar21 + 5)] == *puVar30)); puVar21 = puVar21 + 1)
    {
      puVar30 = puVar30 + 1;
    }
  }
  else {
    uVar15 = *(ulong *)((long)plVar26 + uVar11 * 8 + 5);
    if (uVar15 == *(ulong *)(puVar29 + uVar11 * 8 + 5)) goto code_r0x0012efec;
    uVar15 = *(ulong *)(puVar29 + uVar11 * 8 + 5) ^ uVar15;
    uVar11 = 0;
    if (uVar15 != 0) {
      for (; (uVar15 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
      }
    }
    local_5d8 = (uint8_t *)((uVar11 >> 3 & 0x1fffffff) - lVar16);
  }
  uVar11 = (long)plVar26 - (long)plVar27;
  if (uVar11 < 0x1842) {
    if (uVar11 < 6) {
      uVar15 = *storage_ix;
      uVar24 = cmd_depth[uVar11 + 0x28] + uVar15;
      *(ulong *)(storage + (uVar15 >> 3)) =
           (ulong)cmd_bits[uVar11 + 0x28] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
      *storage_ix = uVar24;
      puVar8 = cmd_histo + uVar11 + 0x28;
    }
    else if (uVar11 < 0x82) {
      uVar15 = uVar11 - 2;
      uVar7 = 0x1f;
      if ((uint)uVar15 != 0) {
        for (; (uint)uVar15 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = (uVar7 ^ 0xffffffe0) + 0x1f;
      uVar17 = uVar15 >> ((byte)uVar7 & 0x3f);
      lVar16 = uVar17 + (ulong)uVar7 * 2;
      uVar22 = *storage_ix;
      uVar24 = cmd_depth[lVar16 + 0x2a] + uVar22;
      *(ulong *)(storage + (uVar22 >> 3)) =
           (ulong)cmd_bits[lVar16 + 0x2a] << ((byte)uVar22 & 7) | (ulong)storage[uVar22 >> 3];
      *storage_ix = uVar24;
      *(ulong *)(storage + (uVar24 >> 3)) =
           uVar15 - (uVar17 << ((byte)uVar7 & 0x3f)) << ((byte)uVar24 & 7) |
           (ulong)storage[uVar24 >> 3];
      uVar24 = uVar24 + uVar7;
      *storage_ix = uVar24;
      puVar8 = cmd_histo + lVar16 + 0x2a;
    }
    else if (uVar11 < 0x842) {
      uVar5 = (int)uVar11 - 0x42;
      uVar7 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      lVar16 = 0x51 - (ulong)(uVar7 ^ 0x1f);
      uVar15 = *storage_ix;
      uVar22 = cmd_depth[lVar16] + uVar15;
      *(ulong *)(storage + (uVar15 >> 3)) =
           (ulong)cmd_bits[lVar16] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
      *storage_ix = uVar22;
      uVar24 = uVar7 + uVar22;
      *(ulong *)(storage + (uVar22 >> 3)) =
           (-1L << ((byte)uVar7 & 0x3f)) + uVar11 + -0x42 << ((byte)uVar22 & 7) |
           (ulong)storage[uVar22 >> 3];
      *storage_ix = uVar24;
      puVar8 = cmd_histo + lVar16;
    }
    else {
      uVar22 = *storage_ix;
      uVar15 = uVar22 + cmd_depth[0x3d];
      uVar24 = cmd_depth[0x3d] + uVar22 + 0xc;
      *(ulong *)(storage + (uVar22 >> 3)) =
           (ulong)cmd_bits[0x3d] << ((byte)uVar22 & 7) | (ulong)storage[uVar22 >> 3];
      *storage_ix = uVar15;
      *(ulong *)(storage + (uVar15 >> 3)) =
           uVar11 - 0x842 << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
      *storage_ix = uVar24;
      puVar8 = cmd_histo + 0x3d;
    }
  }
  else {
    uVar15 = ((long)plVar27 - (long)begin) * 0x32;
    if ((uVar15 < uVar11 || uVar15 - uVar11 == 0) && (0x3d4 < local_590)) {
      EmitUncompressedMetaBlock
                ((uint8_t *)begin,(uint8_t *)plVar26,storage_ix_start,storage_ix,storage);
      input_size = (long)plVar25 +
                   (long)(((Elf64_Ehdr *)input_size)->e_ident_magic_str + (-1 - (long)plVar26));
      data = plVar26;
      goto LAB_0013014c;
    }
    if (uVar11 < 0x5842) {
      uVar24 = (ulong)cmd_depth[0x3e];
      uVar22 = *storage_ix;
      uVar15 = uVar22 + uVar24;
      uVar24 = uVar24 + uVar22 + 0xe;
      *(ulong *)(storage + (uVar22 >> 3)) =
           (ulong)cmd_bits[0x3e] << ((byte)uVar22 & 7) | (ulong)storage[uVar22 >> 3];
      *storage_ix = uVar15;
      *(ulong *)(storage + (uVar15 >> 3)) =
           uVar11 - 0x1842 << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
      *storage_ix = uVar24;
      puVar8 = cmd_histo + 0x3e;
    }
    else {
      uVar24 = (ulong)cmd_depth[0x3f];
      uVar22 = *storage_ix;
      uVar15 = uVar22 + uVar24;
      uVar24 = uVar24 + uVar22 + 0x18;
      *(ulong *)(storage + (uVar22 >> 3)) =
           (ulong)cmd_bits[0x3f] << ((byte)uVar22 & 7) | (ulong)storage[uVar22 >> 3];
      *storage_ix = uVar15;
      *(ulong *)(storage + (uVar15 >> 3)) =
           uVar11 - 0x5842 << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
      *storage_ix = uVar24;
      puVar8 = cmd_histo + 0x3f;
    }
  }
  puVar29 = local_5d8 + 5;
  *puVar8 = *puVar8 + 1;
  for (uVar15 = 0; bVar3 = (byte)uVar24, uVar11 != uVar15; uVar15 = uVar15 + 1) {
    bVar2 = lit_depth[*(byte *)((long)plVar27 + uVar15)];
    *(ulong *)(storage + (uVar24 >> 3)) =
         (ulong)lit_bits[*(byte *)((long)plVar27 + uVar15)] << (bVar3 & 7) |
         (ulong)storage[uVar24 >> 3];
    uVar24 = uVar24 + bVar2;
    *storage_ix = uVar24;
  }
  if (iVar6 == (int)uVar19) {
    bVar2 = cmd_depth[0x40];
    *(ulong *)(storage + (uVar24 >> 3)) =
         (ulong)cmd_bits[0x40] << (bVar3 & 7) | (ulong)storage[uVar24 >> 3];
    uVar24 = bVar2 + uVar24;
    cmd_histo[0x40] = cmd_histo[0x40] + 1;
  }
  else {
    uVar14 = (long)(int)uVar19 + 3;
    uVar7 = 0x1f;
    if ((uint)uVar14 != 0) {
      for (; (uint)uVar14 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar5 = 0x1e - (uVar7 ^ 0x1f);
    uVar15 = (ulong)((uVar14 >> ((ulong)uVar5 & 0x3f) & 1) != 0);
    uVar11 = ((uVar7 ^ 0x1f) * 2 ^ 0x3e) - 4 | uVar15;
    bVar2 = cmd_depth[uVar11 + 0x50];
    *(ulong *)(storage + (uVar24 >> 3)) =
         (ulong)cmd_bits[uVar11 + 0x50] << (bVar3 & 7) | (ulong)storage[uVar24 >> 3];
    uVar24 = bVar2 + uVar24;
    *storage_ix = uVar24;
    *(ulong *)(storage + (uVar24 >> 3)) =
         uVar14 - (uVar15 + 2 << ((byte)uVar5 & 0x3f)) << ((byte)uVar24 & 7) |
         (ulong)storage[uVar24 >> 3];
    uVar24 = uVar24 + uVar5;
    cmd_histo[uVar11 + 0x50] = cmd_histo[uVar11 + 0x50] + 1;
    uVar14 = uVar19 & 0xffffffff;
  }
  *storage_ix = uVar24;
  bVar3 = (byte)uVar24;
  if (puVar29 < (uint8_t *)0xc) {
    bVar2 = cmd_depth[(long)(local_5d8 + 1)];
    *(ulong *)(storage + (uVar24 >> 3)) =
         (ulong)cmd_bits[(long)(local_5d8 + 1)] << (bVar3 & 7) | (ulong)storage[uVar24 >> 3];
    *storage_ix = bVar2 + uVar24;
    puVar8 = cmd_histo + (long)(local_5d8 + 1);
  }
  else if (puVar29 < (uint8_t *)0x48) {
    puVar29 = local_5d8 + -3;
    uVar7 = 0x1f;
    if ((uint)puVar29 != 0) {
      for (; (uint)puVar29 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = (uVar7 ^ 0xffffffe0) + 0x1f;
    uVar11 = (ulong)puVar29 >> ((byte)uVar7 & 0x3f);
    lVar16 = uVar11 + (ulong)uVar7 * 2;
    bVar2 = cmd_depth[lVar16 + 4];
    *(ulong *)(storage + (uVar24 >> 3)) =
         (ulong)cmd_bits[lVar16 + 4] << (bVar3 & 7) | (ulong)storage[uVar24 >> 3];
    uVar24 = bVar2 + uVar24;
    *storage_ix = uVar24;
    *(ulong *)(storage + (uVar24 >> 3)) =
         (long)puVar29 - (uVar11 << ((byte)uVar7 & 0x3f)) << ((byte)uVar24 & 7) |
         (ulong)storage[uVar24 >> 3];
    *storage_ix = uVar24 + uVar7;
    puVar8 = cmd_histo + lVar16 + 4;
  }
  else {
    if (puVar29 < (uint8_t *)0x88) {
      uVar15 = (ulong)(local_5d8 + -3) >> 5;
      bVar2 = cmd_depth[uVar15 + 0x1e];
      *(ulong *)(storage + (uVar24 >> 3)) =
           (ulong)cmd_bits[uVar15 + 0x1e] << (bVar3 & 7) | (ulong)storage[uVar24 >> 3];
      uVar11 = uVar24 + bVar2;
      *storage_ix = uVar11;
      *(ulong *)(storage + (uVar11 >> 3)) =
           (ulong)((uint)(local_5d8 + -3) & 0x1f) << ((byte)uVar11 & 7) |
           (ulong)storage[uVar11 >> 3];
      uVar19 = uVar24 + bVar2 + 5;
      *storage_ix = uVar19;
      bVar3 = cmd_depth[0x40];
      *(ulong *)(storage + (uVar19 >> 3)) =
           (ulong)cmd_bits[0x40] << ((byte)uVar19 & 7) | (ulong)storage[uVar19 >> 3];
      *storage_ix = bVar3 + uVar11 + 5;
      cmd_histo[uVar15 + 0x1e] = cmd_histo[uVar15 + 0x1e] + 1;
    }
    else if (puVar29 < (uint8_t *)0x848) {
      uVar5 = (int)local_5d8 - 0x43;
      uVar7 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      lVar16 = 0x3b - (ulong)(uVar7 ^ 0x1f);
      bVar2 = cmd_depth[lVar16];
      *(ulong *)(storage + (uVar24 >> 3)) =
           (ulong)cmd_bits[lVar16] << (bVar3 & 7) | (ulong)storage[uVar24 >> 3];
      uVar24 = bVar2 + uVar24;
      *storage_ix = uVar24;
      uVar11 = uVar7 + uVar24;
      *(ulong *)(storage + (uVar24 >> 3)) =
           (long)(local_5d8 + (-1L << ((byte)uVar7 & 0x3f)) + -0x43) << ((byte)uVar24 & 7) |
           (ulong)storage[uVar24 >> 3];
      *storage_ix = uVar11;
      bVar3 = cmd_depth[0x40];
      *(ulong *)(storage + (uVar11 >> 3)) =
           (ulong)cmd_bits[0x40] << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
      *storage_ix = bVar3 + uVar11;
      cmd_histo[lVar16] = cmd_histo[lVar16] + 1;
    }
    else {
      bVar2 = cmd_depth[0x27];
      *(ulong *)(storage + (uVar24 >> 3)) =
           (ulong)cmd_bits[0x27] << (bVar3 & 7) | (ulong)storage[uVar24 >> 3];
      uVar11 = uVar24 + bVar2;
      *storage_ix = uVar11;
      bVar10 = (byte)uVar11 & 7;
      *(ulong *)(storage + (uVar11 >> 3)) =
           (long)(local_5d8 + -0x843) << bVar10 | (ulong)storage[uVar11 >> 3];
      uVar19 = bVar2 + uVar24 + 0x18;
      *storage_ix = uVar19;
      bVar3 = cmd_depth[0x40];
      uVar19 = uVar19 >> 3;
      *(ulong *)(storage + uVar19) = (ulong)cmd_bits[0x40] << bVar10 | (ulong)storage[uVar19];
      *storage_ix = bVar3 + uVar11 + 0x18;
      cmd_histo[0x27] = cmd_histo[0x27] + 1;
    }
    puVar8 = cmd_histo + 0x40;
  }
  *puVar8 = *puVar8 + 1;
  plVar27 = (long *)((long)plVar26 + (long)(local_5d8 + 5));
  while( true ) {
    if ((long *)((long)pdVar12 + (long)plVar25) <= plVar27) goto LAB_0012fca7;
    uVar11 = *(ulong *)((long)plVar27 + -3);
    uVar19 = (uVar11 >> 0x18) * 0x1e35a7bd000000 >> 0x31;
    iVar18 = (int)plVar27 - iVar28;
    table[uVar11 * 0x1e35a7bd000000 >> 0x31] = iVar18 + -3;
    table[(uVar11 >> 8) * 0x1e35a7bd000000 >> 0x31] = iVar18 + -2;
    table[(uVar11 >> 0x10) * 0x1e35a7bd000000 >> 0x31] = iVar18 + -1;
    iVar6 = table[uVar19];
    table[uVar19] = iVar18;
    puVar29 = input + iVar6;
    plVar26 = plVar27;
    if (((int)*plVar27 != *(int *)(input + iVar6)) ||
       (*(uint8_t *)((long)plVar27 + 4) != puVar29[4])) break;
    puVar13 = (uint8_t *)((long)data + (-5 - (long)plVar27));
    puVar21 = (uint8_t *)((ulong)puVar13 & 0xfffffffffffffff8);
    uVar11 = 0;
    lVar16 = 0;
LAB_0012f7c9:
    if ((ulong)puVar13 >> 3 == uVar11) {
      uVar11 = (ulong)((uint)puVar13 & 7);
      puVar20 = (uint8_t *)((long)plVar27 + (5 - lVar16));
      for (; (bVar31 = uVar11 != 0, uVar11 = uVar11 - 1, puVar30 = puVar13, bVar31 &&
             (puVar30 = puVar21, puVar29[(long)(puVar21 + 5)] == *puVar20)); puVar21 = puVar21 + 1)
      {
        puVar20 = puVar20 + 1;
      }
    }
    else {
      uVar19 = *(ulong *)((long)plVar27 + uVar11 * 8 + 5);
      if (uVar19 == *(ulong *)(puVar29 + uVar11 * 8 + 5)) goto code_r0x0012f7df;
      uVar19 = *(ulong *)(puVar29 + uVar11 * 8 + 5) ^ uVar19;
      uVar11 = 0;
      if (uVar19 != 0) {
        for (; (uVar19 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
        }
      }
      puVar30 = (uint8_t *)((uVar11 >> 3 & 0x1fffffff) - lVar16);
    }
    uVar11 = (long)plVar27 - (long)puVar29;
    if (0x3fff0 < (long)uVar11) break;
    puVar29 = puVar30 + 5;
    if (puVar29 < (uint8_t *)0xa) {
      uVar19 = *storage_ix;
      uVar14 = cmd_depth[(long)(puVar30 + 0x13)] + uVar19;
      *(ulong *)(storage + (uVar19 >> 3)) =
           (ulong)cmd_bits[(long)(puVar30 + 0x13)] << ((byte)uVar19 & 7) |
           (ulong)storage[uVar19 >> 3];
      *storage_ix = uVar14;
      puVar8 = cmd_histo + (long)(puVar30 + 0x13);
    }
    else if (puVar29 < (uint8_t *)0x86) {
      puVar29 = puVar30 + -1;
      uVar7 = 0x1f;
      if ((uint)puVar29 != 0) {
        for (; (uint)puVar29 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = (uVar7 ^ 0xffffffe0) + 0x1f;
      uVar15 = (ulong)puVar29 >> ((byte)uVar7 & 0x3f);
      lVar16 = uVar15 + (ulong)uVar7 * 2;
      uVar19 = *storage_ix;
      uVar14 = cmd_depth[lVar16 + 0x14] + uVar19;
      *(ulong *)(storage + (uVar19 >> 3)) =
           (ulong)cmd_bits[lVar16 + 0x14] << ((byte)uVar19 & 7) | (ulong)storage[uVar19 >> 3];
      *storage_ix = uVar14;
      *(ulong *)(storage + (uVar14 >> 3)) =
           (long)puVar29 - (uVar15 << ((byte)uVar7 & 0x3f)) << ((byte)uVar14 & 7) |
           (ulong)storage[uVar14 >> 3];
      uVar14 = uVar14 + uVar7;
      *storage_ix = uVar14;
      puVar8 = cmd_histo + lVar16 + 0x14;
    }
    else if (puVar29 < (uint8_t *)0x846) {
      uVar5 = (int)puVar30 - 0x41;
      uVar7 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      lVar16 = 0x3b - (ulong)(uVar7 ^ 0x1f);
      uVar14 = *storage_ix;
      uVar19 = cmd_depth[lVar16] + uVar14;
      *(ulong *)(storage + (uVar14 >> 3)) =
           (ulong)cmd_bits[lVar16] << ((byte)uVar14 & 7) | (ulong)storage[uVar14 >> 3];
      *storage_ix = uVar19;
      uVar14 = uVar7 + uVar19;
      *(ulong *)(storage + (uVar19 >> 3)) =
           (long)(puVar30 + (-1L << ((byte)uVar7 & 0x3f)) + -0x41) << ((byte)uVar19 & 7) |
           (ulong)storage[uVar19 >> 3];
      *storage_ix = uVar14;
      puVar8 = cmd_histo + lVar16;
    }
    else {
      uVar15 = *storage_ix;
      uVar19 = uVar15 + cmd_depth[0x27];
      uVar14 = cmd_depth[0x27] + uVar15 + 0x18;
      *(ulong *)(storage + (uVar15 >> 3)) =
           (ulong)cmd_bits[0x27] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
      *storage_ix = uVar19;
      *(ulong *)(storage + (uVar19 >> 3)) =
           (long)(puVar30 + -0x841) << ((byte)uVar19 & 7) | (ulong)storage[uVar19 >> 3];
      *storage_ix = uVar14;
      puVar8 = cmd_histo + 0x27;
    }
    *puVar8 = *puVar8 + 1;
    uVar19 = (long)(int)uVar11 + 3;
    uVar7 = 0x1f;
    if ((uint)uVar19 != 0) {
      for (; (uint)uVar19 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar5 = 0x1e - (uVar7 ^ 0x1f);
    uVar15 = (ulong)((uVar19 >> ((ulong)uVar5 & 0x3f) & 1) != 0);
    uVar22 = ((uVar7 ^ 0x1f) * 2 ^ 0x3e) - 4 | uVar15;
    bVar3 = cmd_depth[uVar22 + 0x50];
    *(ulong *)(storage + (uVar14 >> 3)) =
         (ulong)cmd_bits[uVar22 + 0x50] << ((byte)uVar14 & 7) | (ulong)storage[uVar14 >> 3];
    uVar14 = bVar3 + uVar14;
    *storage_ix = uVar14;
    *(ulong *)(storage + (uVar14 >> 3)) =
         uVar19 - (uVar15 + 2 << ((byte)uVar5 & 0x3f)) << ((byte)uVar14 & 7) |
         (ulong)storage[uVar14 >> 3];
    *storage_ix = uVar14 + uVar5;
    cmd_histo[uVar22 + 0x50] = cmd_histo[uVar22 + 0x50] + 1;
    plVar27 = (long *)((long)plVar27 + (long)(puVar30 + 5));
    uVar14 = uVar11 & 0xffffffff;
  }
  goto LAB_0012ef12;
code_r0x0012efec:
  lVar16 = lVar16 + -8;
  uVar11 = uVar11 + 1;
  goto LAB_0012efd5;
code_r0x0012f7df:
  lVar16 = lVar16 + -8;
  uVar11 = uVar11 + 1;
  goto LAB_0012f7c9;
LAB_0012fd23:
  if (plVar27 < data) {
    uVar14 = (long)data - (long)plVar27;
    if (uVar14 < 0x1842) {
      if (uVar14 < 6) {
        uVar19 = *storage_ix;
        uVar11 = cmd_depth[uVar14 + 0x28] + uVar19;
        *(ulong *)(storage + (uVar19 >> 3)) =
             (ulong)cmd_bits[uVar14 + 0x28] << ((byte)uVar19 & 7) | (ulong)storage[uVar19 >> 3];
        *storage_ix = uVar11;
        puVar8 = cmd_histo + uVar14 + 0x28;
      }
      else if (uVar14 < 0x82) {
        uVar19 = uVar14 - 2;
        uVar7 = 0x1f;
        if ((uint)uVar19 != 0) {
          for (; (uint)uVar19 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        uVar7 = (uVar7 ^ 0xffffffe0) + 0x1f;
        uVar22 = uVar19 >> ((byte)uVar7 & 0x3f);
        lVar16 = uVar22 + (ulong)uVar7 * 2;
        uVar15 = *storage_ix;
        uVar11 = cmd_depth[lVar16 + 0x2a] + uVar15;
        *(ulong *)(storage + (uVar15 >> 3)) =
             (ulong)cmd_bits[lVar16 + 0x2a] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
        *storage_ix = uVar11;
        *(ulong *)(storage + (uVar11 >> 3)) =
             uVar19 - (uVar22 << ((byte)uVar7 & 0x3f)) << ((byte)uVar11 & 7) |
             (ulong)storage[uVar11 >> 3];
        uVar11 = uVar11 + uVar7;
        *storage_ix = uVar11;
        puVar8 = cmd_histo + lVar16 + 0x2a;
      }
      else if (uVar14 < 0x842) {
        uVar5 = (int)uVar14 - 0x42;
        uVar7 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        lVar16 = 0x51 - (ulong)(uVar7 ^ 0x1f);
        uVar11 = *storage_ix;
        uVar19 = cmd_depth[lVar16] + uVar11;
        *(ulong *)(storage + (uVar11 >> 3)) =
             (ulong)cmd_bits[lVar16] << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
        *storage_ix = uVar19;
        uVar11 = uVar7 + uVar19;
        *(ulong *)(storage + (uVar19 >> 3)) =
             (-1L << ((byte)uVar7 & 0x3f)) + uVar14 + -0x42 << ((byte)uVar19 & 7) |
             (ulong)storage[uVar19 >> 3];
        *storage_ix = uVar11;
        puVar8 = cmd_histo + lVar16;
      }
      else {
        uVar15 = *storage_ix;
        uVar19 = uVar15 + cmd_depth[0x3d];
        uVar11 = cmd_depth[0x3d] + uVar15 + 0xc;
        *(ulong *)(storage + (uVar15 >> 3)) =
             (ulong)cmd_bits[0x3d] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
        *storage_ix = uVar19;
        *(ulong *)(storage + (uVar19 >> 3)) =
             uVar14 - 0x842 << ((byte)uVar19 & 7) | (ulong)storage[uVar19 >> 3];
        *storage_ix = uVar11;
        puVar8 = cmd_histo + 0x3d;
      }
      *puVar8 = *puVar8 + 1;
      for (uVar19 = 0; uVar14 != uVar19; uVar19 = uVar19 + 1) {
        bVar3 = lit_depth[*(byte *)((long)plVar27 + uVar19)];
        *(ulong *)(storage + (uVar11 >> 3)) =
             (ulong)lit_bits[*(byte *)((long)plVar27 + uVar19)] << ((byte)uVar11 & 7) |
             (ulong)storage[uVar11 >> 3];
        uVar11 = uVar11 + bVar3;
        *storage_ix = uVar11;
      }
    }
    else {
      uVar11 = ((long)plVar27 - (long)begin) * 0x32;
      if ((uVar11 < uVar14 || uVar11 - uVar14 == 0) && (0x3d4 < local_590)) {
        EmitUncompressedMetaBlock
                  ((uint8_t *)begin,(uint8_t *)data,storage_ix_start,storage_ix,storage);
      }
      else {
        bVar31 = uVar14 < 0x5842;
        pbVar9 = cmd_depth + 0x3f;
        puVar4 = cmd_bits + 0x3f;
        if (bVar31) {
          pbVar9 = cmd_depth + 0x3e;
          puVar4 = cmd_bits + 0x3e;
        }
        bVar3 = *pbVar9;
        uVar11 = *storage_ix;
        lVar16 = uVar11 + 0x18;
        if (bVar31) {
          lVar16 = uVar11 + 0xe;
        }
        uVar19 = lVar16 + (ulong)bVar3;
        *(ulong *)(storage + (uVar11 >> 3)) =
             (ulong)*puVar4 << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
        uVar11 = uVar11 + bVar3;
        *storage_ix = uVar11;
        *(ulong *)(storage + (uVar11 >> 3)) =
             ((ulong)bVar31 << 0xe | 0xffffffffffffa7be) + uVar14 << ((byte)uVar11 & 7) |
             (ulong)storage[uVar11 >> 3];
        cmd_histo[(ulong)!bVar31 + 0x3e] = cmd_histo[(ulong)!bVar31 + 0x3e] + 1;
        *storage_ix = uVar19;
        for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
          bVar3 = lit_depth[*(byte *)((long)plVar27 + uVar11)];
          *(ulong *)(storage + (uVar19 >> 3)) =
               (ulong)lit_bits[*(byte *)((long)plVar27 + uVar11)] << ((byte)uVar19 & 7) |
               (ulong)storage[uVar19 >> 3];
          uVar19 = uVar19 + bVar3;
          *storage_ix = uVar19;
        }
      }
    }
  }
LAB_0013014c:
  if ((Elf64_Ehdr *)input_size == (Elf64_Ehdr *)0x0) {
    if (is_last == 0) {
      *cmd_code = '\0';
      *cmd_code_numbits = 0;
      BuildAndStoreCommandPrefixCode(cmd_histo,cmd_depth,cmd_bits,cmd_code_numbits,cmd_code);
    }
    return;
  }
  local_5b8 = (Elf64_Ehdr *)0x18000;
  if (input_size < (Elf64_Ehdr *)0x18000) {
    local_5b8 = (Elf64_Ehdr *)input_size;
  }
  storage_ix_start = *storage_ix;
  BrotliStoreMetaBlockHeader((size_t)local_5b8,0,storage_ix,storage);
  uVar14 = *storage_ix;
  uVar11 = uVar14 >> 3;
  *(ulong *)(storage + uVar11) = (ulong)storage[uVar11];
  *storage_ix = uVar14 + 0xd;
  local_590 = BuildAndStoreLiteralPrefixCode
                        (m,(uint8_t *)data,(size_t)local_5b8,lit_depth,lit_bits,storage_ix,storage);
  BuildAndStoreCommandPrefixCode(cmd_histo,cmd_depth,cmd_bits,storage_ix,storage);
  begin = data;
  goto LAB_0012ee87;
}

Assistant:

void BrotliCompressFragmentFast(
    MemoryManager* m, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, int* table, size_t table_size, uint8_t cmd_depth[128],
    uint16_t cmd_bits[128], size_t* cmd_code_numbits, uint8_t* cmd_code,
    size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);

  if (input_size == 0) {
    BROTLI_DCHECK(is_last);
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
    return;
  }

  switch (table_bits) {
#define CASE_(B)                                                     \
    case B:                                                          \
      BrotliCompressFragmentFastImpl ## B(                           \
          m, input, input_size, is_last, table, cmd_depth, cmd_bits, \
          cmd_code_numbits, cmd_code, storage_ix, storage);          \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    EmitUncompressedMetaBlock(input, input + input_size, initial_storage_ix,
                              storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}